

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O2

int Granulator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  int iVar1;
  GranulatorSample *pGVar2;
  undefined8 uVar3;
  Grain *pGVar4;
  EffectData *data;
  undefined1 *puVar5;
  Grain *pGVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  Grain *this;
  float *pfVar13;
  int n;
  Grain *pGVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  GranulatorSample *local_70;
  MutexScopeLock mutexScope;
  
  data = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  uVar7 = (uint)data->p[0xc];
  puVar5 = (undefined1 *)0x0;
  if ((int)uVar7 >= 0) {
    puVar5 = sampleMutex;
  }
  fVar20 = (float)(int)(state->field_0).field_0.samplerate;
  fVar18 = data->p[5];
  mutexScope.mutex = (Mutex *)puVar5;
  if ((int)uVar7 < 0) {
    local_70 = &data->delay;
    (data->delay).numchannels = inchannels;
  }
  else {
    Mutex::Lock((Mutex *)sampleMutex);
    (data->delay).numchannels = inchannels;
    if (GetGranulatorSample(int)::initialized == '\0') {
      memset(GetGranulatorSample(int)::samples,0,0x4280);
      GetGranulatorSample(int)::initialized = '\x01';
    }
    local_70 = (GranulatorSample *)(GetGranulatorSample(int)::samples + (ulong)uVar7 * 0x428);
  }
  uVar8 = 0;
  uVar9 = 0;
  if (0 < inchannels) {
    uVar9 = (ulong)(uint)inchannels;
  }
  for (; uVar8 != length; uVar8 = uVar8 + 1) {
    bVar15 = false;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      uVar16 = -(uint)(data->env[uVar10] < ABS(inbuffer[uVar10]) + 1e-11);
      fVar19 = (float)(~uVar16 & (uint)(data->env[uVar10] * 0.9995) |
                      (uint)(ABS(inbuffer[uVar10]) + 1e-11) & uVar16);
      data->env[uVar10] = fVar19;
      bVar15 = (bool)(bVar15 | fVar18 + fVar18 < fVar19);
    }
    if (bVar15) {
      uVar16 = data->delaypos - 1U & 0x3ffff;
      data->delaypos = uVar16;
      lVar11 = (long)(int)(uVar16 * inchannels);
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        fVar19 = inbuffer[uVar10];
        (data->delay).data[lVar11 + uVar10] = fVar19;
        dVar21 = data->integrator[uVar10] * 0.9998999834060669 + (double)ABS(fVar19);
        data->integrator[uVar10] = dVar21;
        (data->delay).preview[lVar11 + uVar10] = (float)dVar21;
      }
    }
    inbuffer = inbuffer + inchannels;
  }
  memset(outbuffer,0,(ulong)(outchannels * length) << 2);
  uVar8 = (state->field_0).field_0.flags;
  if ((uVar8 & 6) == 0) {
    if ((uVar8 & 1) == 0) {
      ResetGrains(data);
    }
    else {
      debug_graincount = data->activegrains;
      fVar18 = data->p[8] * data->nextrandtime + data->p[7];
      uVar8 = -(uint)(0.0 < fVar18);
      fVar18 = (float)(~uVar8 & 0x4cbebc20 | (uint)(fVar20 / fVar18) & uVar8);
      pGVar6 = data->grains;
      for (uVar8 = 0; length != uVar8; uVar8 = uVar8 + 1) {
        fVar19 = data->samplecounter + 1.0;
        data->samplecounter = fVar19;
        if (fVar18 <= fVar19) {
          fVar19 = fVar19 - fVar18;
          data->samplecounter = fVar19;
          uVar16 = (data->random).seed * 0x19660d + 0x3c6ef35f;
          (data->random).seed = uVar16;
          fVar18 = (float)(uVar16 & 0xffffff ^ uVar16 >> 0x10) * 5.960465e-08 + 0.0;
          data->nextrandtime = fVar18;
          fVar18 = fVar18 * data->p[8] + data->p[7];
          uVar17 = -(uint)(0.0 < fVar18);
          fVar18 = (float)(~uVar17 & 0x4cbebc20 | (uint)(fVar20 / fVar18) & uVar17);
          iVar1 = data->activegrains;
          if (((long)iVar1 < 500) && (local_70->numsamples != 0)) {
            data->activegrains = iVar1 + 1;
            uVar16 = uVar16 * 0x19660d + 0x3c6ef35f;
            (data->random).seed = uVar16;
            iVar12 = 0;
            if ((int)uVar7 < 0) {
              iVar12 = data->delaypos;
            }
            Grain::Setup(pGVar6 + iVar1,local_70,
                         (uVar16 >> 0x10 ^ uVar16) % (uint)local_70->numchannels,&data->random,
                         1.0 / fVar20,iVar12,data->p,(float)(int)uVar8 + (1.0 - fVar19),
                         uVar7 >> 0x1f);
          }
        }
      }
      pGVar14 = pGVar6 + data->activegrains;
      this = pGVar6;
      while (pfVar13 = outbuffer + 1, uVar7 = length, this < pGVar14) {
        while (bVar15 = uVar7 != 0, uVar7 = uVar7 - 1, bVar15) {
          fVar18 = Grain::Scan(this);
          pfVar13[-1] = (1.0 - this->pan) * fVar18 + pfVar13[-1];
          *pfVar13 = fVar18 * this->pan + *pfVar13;
          pfVar13 = pfVar13 + outchannels;
        }
        if (this->pos < 0.99999) {
          this = this + 1;
        }
        else {
          fVar18 = pGVar14[-1].shape;
          this->pan = pGVar14[-1].pan;
          this->shape = fVar18;
          pGVar2 = pGVar14[-1].sample;
          iVar1 = pGVar14[-1].channel;
          iVar12 = pGVar14[-1].length;
          pGVar4 = pGVar14 + -1;
          fVar18 = pGVar14[-1].offset;
          uVar3 = *(undefined8 *)&pGVar14[-1].pos;
          pGVar14 = pGVar14 + -1;
          this->wrapping = pGVar4->wrapping;
          this->offset = fVar18;
          *(undefined8 *)&this->pos = uVar3;
          this->sample = pGVar2;
          this->channel = iVar1;
          this->length = iVar12;
        }
      }
      data->activegrains = (int)(((long)pGVar14 - (long)pGVar6) / 0x28);
    }
  }
  MutexScopeLock::~MutexScopeLock(&mutexScope);
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        const int samplerate = state->samplerate;
        const float sampletime = 1.0f / (float)samplerate;
        const float freeze = data->p[P_FREEZE] * 2.0f;
        const int usesample = (int)data->p[P_USESAMPLE];
        const float* params = data->p;

        MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);

        data->delay.numchannels = inchannels;

        GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;

        // Fill in live data
        const float* src = inbuffer;
        for (int n = 0; n < length; n++)
        {
            bool record = false;
            for (int i = 0; i < inchannels; i++)
            {
                float input = src[i];
                float a = fabsf(input) + 1.0e-11f;
                data->env[i] = (a > data->env[i]) ? a : (data->env[i] * 0.9995f);
                record |= (data->env[i] > freeze);
            }
            if (record)
            {
                data->delaypos = (data->delaypos + MAXDELAYLENGTH - 1) & (MAXDELAYLENGTH - 1);
                for (int i = 0; i < inchannels; i++)
                {
                    data->delay.data[data->delaypos * inchannels + i] = src[i];

                    // Calculate integrated signal on the fly for better reconstruction in GetFloatBufferCallback.
                    // The small leak of 0.1% prevents build-up of DC.
                    data->integrator[i] = data->integrator[i] * 0.9999f + fabsf(src[i]);
                    data->delay.preview[data->delaypos * inchannels + i] = data->integrator[i];
                }
            }
            src += inchannels;
        }

        memset(outbuffer, 0, length * outchannels * sizeof(float));

        if (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused))
            return UNITY_AUDIODSP_OK;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0)
        {
            ResetGrains(data);
            return UNITY_AUDIODSP_OK;
        }

        debug_graincount = data->activegrains;

        // Fill in new grains
        float rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
        float nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
        for (int n = 0; n < length; n++)
        {
            if (++data->samplecounter >= nexteventsample)
            {
                data->samplecounter -= nexteventsample;
                float fracpos = 1.0f - data->samplecounter;
                data->nextrandtime = data->random.GetFloat(0.0f, 1.0f);
                rate = data->p[P_RATE] + data->p[P_RRATE] * data->nextrandtime;
                nexteventsample = (rate > 0.0f) ? (samplerate / rate) : 100000000;
                if (data->activegrains >= MAXGRAINS || gs->numsamples == 0)
                    continue;
                data->grains[data->activegrains++].Setup(
                    gs,
                    data->random.Get() % gs->numchannels,
                    data->random,
                    sampletime,
                    (usesample >= 0) ? 0 : data->delaypos,
                    params,
                    n + fracpos,
                    usesample < 0
                    );
            }
        }

        // Process grains
        Grain* g = data->grains;
        Grain* g_end = data->grains + data->activegrains;
        while (g < g_end)
        {
            float* dst = outbuffer;
            for (int n = 0; n < length; n++)
            {
                float s = g->Scan();
                dst[0] += s * (1.0f - g->pan);
                dst[1] += s * g->pan;
                dst += outchannels;
            }
            if (g->pos >= 0.99999f)
                *g = *(--g_end);
            else
                ++g;
        }
        data->activegrains = g_end - data->grains;

        return UNITY_AUDIODSP_OK;
    }